

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__filename;
  int *piVar1;
  size_type sVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  mapped_type *pmVar7;
  void *in_R8;
  bool bVar8;
  FILE *__stream;
  char *binpath;
  float scale;
  vector<float,_std::allocator<float>_> scales;
  string key_str;
  NetQuantize quantizer;
  char key [256];
  float local_32c;
  float *local_328;
  iterator iStack_320;
  float *local_318;
  FILE *local_308;
  char *local_300;
  float *local_2f8;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 local_2e0;
  long *local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined4 local_2c0;
  long local_2b8;
  Mat local_2a8;
  key_type local_258;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  NetQuantize local_210;
  DataReader local_138 [33];
  
  if (argc != 6) {
    main_cold_1();
    return -1;
  }
  local_220 = argv[1];
  pcVar6 = argv[2];
  pcVar4 = argv[3];
  binpath = argv[4];
  __filename = argv[5];
  ModelWriter::ModelWriter(&local_210.super_ModelWriter);
  local_210.super_ModelWriter.super_Net._vptr_Net = (_func_int **)&PTR__NetQuantize_00356650;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.blob_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.weight_int8scale_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__filename != (char *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
    ::clear(&local_210.blob_int8scale_table._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
    ::clear(&local_210.weight_int8scale_table._M_t);
    local_308 = fopen(__filename,"rb");
    if (local_308 == (FILE *)0x0) {
      fprintf(_stderr,"Open %s failed.\n",__filename);
    }
    else {
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      local_318 = (float *)0x0;
      local_328 = (float *)0x0;
      iStack_320._M_current = (float *)0x0;
      local_238 = pcVar6;
      local_230 = binpath;
      local_228 = pcVar4;
      local_300 = (char *)operator_new(0x9c4000);
      memset(local_300,0,0x9c4000);
      __stream = local_308;
      do {
        iVar3 = feof(__stream);
        if ((iVar3 != 0) ||
           (pcVar4 = fgets(local_300,0x9c4000,__stream), pcVar6 = local_300, pcVar4 == (char *)0x0))
        break;
        local_32c = 1.0;
        sVar5 = strcspn(local_300,"\r\n");
        pcVar6[sVar5] = '\0';
        pcVar6 = strtok(pcVar6," ");
        if (pcVar6 == (char *)0x0) break;
        bVar8 = true;
        local_218 = pcVar6;
        do {
          if (bVar8) {
            bVar8 = false;
            __isoc99_sscanf(pcVar6,"%255s",local_138);
            sVar2 = local_258._M_string_length;
            in_R8 = (void *)strlen((char *)local_138);
            std::__cxx11::string::_M_replace((ulong)&local_258,0,(char *)sVar2,(ulong)local_138);
          }
          else {
            __isoc99_sscanf(pcVar6,"%f",&local_32c);
            if (iStack_320._M_current == local_318) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_328,iStack_320,&local_32c);
            }
            else {
              *iStack_320._M_current = local_32c;
              iStack_320._M_current = iStack_320._M_current + 1;
            }
          }
          pcVar6 = strtok((char *)0x0," ");
        } while (pcVar6 != (char *)0x0);
        pcVar6 = strstr(local_258._M_dataplus._M_p,"_param_");
        if (pcVar6 == (char *)0x0) {
          local_2f8 = local_328;
          uStack_2f0 = 0;
          uStack_2ec = 0;
          local_2e8 = 4;
          uStack_2e4 = 0;
          local_2e0 = 1;
          local_2d8 = (long *)0x0;
          iVar3 = (int)((ulong)((long)iStack_320._M_current - (long)local_328) >> 2);
          local_2d0 = CONCAT44(iVar3,1);
          uStack_2c8 = 0x100000001;
          local_2c0 = 1;
          local_2b8 = (long)iVar3;
          ncnn::Mat::clone(&local_2a8,(__fn *)&local_2f8,(void *)0x0,iVar3,in_R8);
          __stream = local_308;
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::operator[](&local_210.blob_int8scale_table,&local_258);
          if (pmVar7 != &local_2a8) {
            piVar1 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            piVar1 = pmVar7->refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (pmVar7->allocator == (Allocator *)0x0) {
                  if (pmVar7->data != (void *)0x0) {
                    free(pmVar7->data);
                  }
                }
                else {
                  (*pmVar7->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pmVar7->cstep = 0;
            pmVar7->data = (void *)0x0;
            pmVar7->refcount = (int *)0x0;
            *(undefined8 *)((long)&pmVar7->refcount + 4) = 0;
            *(undefined8 *)((long)&pmVar7->elemsize + 4) = 0;
            pmVar7->dims = 0;
            pmVar7->w = 0;
            pmVar7->h = 0;
            pmVar7->d = 0;
            pmVar7->c = 0;
            pmVar7->data = local_2a8.data;
            pmVar7->refcount = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
            pmVar7->elemsize = CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
            pmVar7->elempack = local_2a8.elempack;
            pmVar7->allocator = local_2a8.allocator;
            pmVar7->dims = local_2a8.dims;
            pmVar7->w = local_2a8.w;
            pmVar7->h = local_2a8.h;
            pmVar7->d = local_2a8.d;
            pmVar7->c = local_2a8.c;
            pmVar7->cstep = local_2a8.cstep;
          }
          piVar1 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_2a8.allocator == (Allocator *)0x0) {
                if (local_2a8.data != (void *)0x0) {
                  free(local_2a8.data);
                }
              }
              else {
                (*(local_2a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2a8.cstep = 0;
          local_2a8.data = (void *)0x0;
          local_2a8.refcount._0_4_ = 0;
          local_2a8.refcount._4_4_ = 0;
          local_2a8.elemsize._0_4_ = 0;
          local_2a8.elemsize._4_4_ = 0;
          local_2a8.elempack = 0;
          local_2a8.dims = 0;
          local_2a8.w = 0;
          local_2a8.h = 0;
          local_2a8.d = 0;
          local_2a8.c = 0;
          piVar1 = (int *)CONCAT44(uStack_2ec,uStack_2f0);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_2d8 == (long *)0x0) goto LAB_00147261;
              (**(code **)(*local_2d8 + 0x18))();
            }
          }
        }
        else {
          local_2f8 = local_328;
          uStack_2f0 = 0;
          uStack_2ec = 0;
          local_2e8 = 4;
          uStack_2e4 = 0;
          local_2e0 = 1;
          local_2d8 = (long *)0x0;
          iVar3 = (int)((ulong)((long)iStack_320._M_current - (long)local_328) >> 2);
          local_2d0 = CONCAT44(iVar3,1);
          uStack_2c8 = 0x100000001;
          local_2c0 = 1;
          local_2b8 = (long)iVar3;
          ncnn::Mat::clone(&local_2a8,(__fn *)&local_2f8,(void *)0x0,iVar3,in_R8);
          __stream = local_308;
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::operator[](&local_210.weight_int8scale_table,&local_258);
          if (pmVar7 != &local_2a8) {
            piVar1 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            piVar1 = pmVar7->refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (pmVar7->allocator == (Allocator *)0x0) {
                  if (pmVar7->data != (void *)0x0) {
                    free(pmVar7->data);
                  }
                }
                else {
                  (*pmVar7->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pmVar7->cstep = 0;
            pmVar7->data = (void *)0x0;
            pmVar7->refcount = (int *)0x0;
            *(undefined8 *)((long)&pmVar7->refcount + 4) = 0;
            *(undefined8 *)((long)&pmVar7->elemsize + 4) = 0;
            pmVar7->dims = 0;
            pmVar7->w = 0;
            pmVar7->h = 0;
            pmVar7->d = 0;
            pmVar7->c = 0;
            pmVar7->data = local_2a8.data;
            pmVar7->refcount = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
            pmVar7->elemsize = CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
            pmVar7->elempack = local_2a8.elempack;
            pmVar7->allocator = local_2a8.allocator;
            pmVar7->dims = local_2a8.dims;
            pmVar7->w = local_2a8.w;
            pmVar7->h = local_2a8.h;
            pmVar7->d = local_2a8.d;
            pmVar7->c = local_2a8.c;
            pmVar7->cstep = local_2a8.cstep;
          }
          piVar1 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_2a8.allocator == (Allocator *)0x0) {
                if (local_2a8.data != (void *)0x0) {
                  free(local_2a8.data);
                }
              }
              else {
                (*(local_2a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2a8.cstep = 0;
          local_2a8.data = (void *)0x0;
          local_2a8.refcount._0_4_ = 0;
          local_2a8.refcount._4_4_ = 0;
          local_2a8.elemsize._0_4_ = 0;
          local_2a8.elemsize._4_4_ = 0;
          local_2a8.elempack = 0;
          local_2a8.dims = 0;
          local_2a8.w = 0;
          local_2a8.h = 0;
          local_2a8.d = 0;
          local_2a8.c = 0;
          piVar1 = (int *)CONCAT44(uStack_2ec,uStack_2f0);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_2d8 == (long *)0x0) {
LAB_00147261:
                local_2a8.cstep = 0;
                local_2a8.c = 0;
                local_2a8.h = 0;
                local_2a8.d = 0;
                local_2a8.dims = 0;
                local_2a8.w = 0;
                local_2a8.elempack = 0;
                local_2a8.elemsize._4_4_ = 0;
                local_2a8.elemsize._0_4_ = 0;
                local_2a8.refcount._4_4_ = 0;
                local_2a8.refcount._0_4_ = 0;
                local_2a8.data = (void *)0x0;
                if (local_2f8 != (float *)0x0) {
                  free(local_2f8);
                }
              }
              else {
                (**(code **)(*local_2d8 + 0x18))();
              }
            }
          }
        }
        local_2b8 = 0;
        local_2f8 = (float *)0x0;
        uStack_2f0 = 0;
        uStack_2ec = 0;
        local_2e8 = 0;
        uStack_2e4 = 0;
        local_2e0 = 0;
        local_2d0 = 0;
        uStack_2c8 = 0;
        local_2c0 = 0;
        local_258._M_string_length = 0;
        *local_258._M_dataplus._M_p = '\0';
        if (iStack_320._M_current != local_328) {
          iStack_320._M_current = local_328;
        }
      } while (local_218 != (char *)0x0);
      fclose(__stream);
      operator_delete(local_300);
      if (local_328 != (float *)0x0) {
        operator_delete(local_328);
      }
      pcVar4 = local_228;
      binpath = local_230;
      pcVar6 = local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
    }
    if (local_308 == (FILE *)0x0) {
      main_cold_2();
      iVar3 = -1;
      goto LAB_00147407;
    }
  }
  ncnn::Net::load_param((Net *)&local_210,local_220);
  iVar3 = strcmp(pcVar6,"null");
  if (iVar3 == 0) {
    ncnn::DataReader::DataReader(local_138);
    local_138[0]._vptr_DataReader = (_func_int **)&PTR__DataReader_00356760;
    ncnn::Net::load_model((Net *)&local_210,local_138);
    local_210.super_ModelWriter.gen_random_weight = 1;
    ncnn::DataReader::~DataReader(local_138);
  }
  else {
    ncnn::Net::load_model((Net *)&local_210,pcVar6);
  }
  NetQuantize::quantize_convolution(&local_210);
  NetQuantize::quantize_convolutiondepthwise(&local_210);
  NetQuantize::quantize_innerproduct(&local_210);
  NetQuantize::fuse_requantize(&local_210);
  iVar3 = 0;
  ModelWriter::save(&local_210.super_ModelWriter,pcVar4,binpath);
LAB_00147407:
  local_210.super_ModelWriter.super_Net._vptr_Net = (_func_int **)&PTR__NetQuantize_00356650;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  ::~_Rb_tree(&local_210.weight_int8scale_table._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  ::~_Rb_tree(&local_210.blob_int8scale_table._M_t);
  ncnn::Net::~Net((Net *)&local_210);
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 6)
    {
        fprintf(stderr, "usage: %s [inparam] [inbin] [outparam] [outbin] [calibration table]\n", argv[0]);
        return -1;
    }

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    const char* outparam = argv[3];
    const char* outbin = argv[4];
    const char* int8scale_table_path = argv[5];

    NetQuantize quantizer;

    // parse the calibration scale table
    if (int8scale_table_path)
    {
        bool s2 = read_int8scale_table(int8scale_table_path, quantizer.blob_int8scale_table, quantizer.weight_int8scale_table);
        if (!s2)
        {
            fprintf(stderr, "read_int8scale_table failed\n");
            return -1;
        }
    }

    quantizer.load_param(inparam);
    if (strcmp(inbin, "null") == 0)
    {
        DataReaderFromEmpty dr;
        quantizer.load_model(dr);
        quantizer.gen_random_weight = true;
    }
    else
        quantizer.load_model(inbin);

    quantizer.quantize_convolution();
    quantizer.quantize_convolutiondepthwise();
    quantizer.quantize_innerproduct();

    quantizer.fuse_requantize();

    quantizer.save(outparam, outbin);

    return 0;
}